

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O3

void decaf_sha512_update(decaf_sha512_ctx_s *ctx,uint8_t *message,size_t length)

{
  ulong uVar1;
  ulong uVar2;
  ulong __n;
  
  if (length != 0) {
    do {
      uVar2 = (ulong)((uint)ctx->bytes_processed & 0x7f);
      uVar1 = 0x80 - uVar2;
      __n = uVar1;
      if (length < uVar1) {
        __n = length;
      }
      memcpy(ctx->block + uVar2,message,__n);
      ctx->bytes_processed = ctx->bytes_processed + __n;
      if (uVar1 <= length) {
        hashblock(ctx);
      }
      length = length - __n;
      message = message + __n;
    } while (length != 0);
  }
  return;
}

Assistant:

void decaf_sha512_update(decaf_sha512_ctx_t ctx, const uint8_t *message, size_t length) {
    while (length > 0) {
        size_t grab = length, off = ctx->bytes_processed % 128;
        if (grab > 128-off) grab = 128-off;
        memcpy(&ctx->block[off], message, grab);
        
        ctx->bytes_processed += grab;
        length -= grab;
        message += grab;
        
        if (grab == 128 - off) {
            hashblock(ctx);
        }
    }
}